

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

bool __thiscall fmcalc::init_itemtotiv(fmcalc *this)

{
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  long lVar1;
  pointer pvVar2;
  long lVar3;
  pointer pfVar4;
  bool bVar5;
  value_type_conflict2 vVar6;
  long *plVar7;
  FILE *__stream;
  ulong uVar8;
  size_t sVar9;
  pointer pvVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  long *plVar12;
  ulong uVar13;
  value_type_conflict2 vVar14;
  long lVar15;
  long lVar16;
  int level;
  _Rb_tree_node_base *p_Var17;
  long lVar18;
  float fVar19;
  item itm;
  string file;
  vector<float,_std::allocator<float>_> coverages;
  undefined8 local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  undefined1 local_c0 [40];
  vector<float,_std::allocator<float>_> local_98;
  pointer local_80 [2];
  undefined1 local_70 [64];
  
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar5 = loadcoverages(this,&local_98);
  if (bVar5) {
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"input/items.bin","");
    if ((this->inputpath_)._M_string_length != 0) {
      std::__cxx11::string::substr((ulong)local_80,(ulong)local_c0);
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_80,0,(char *)0x0,
                                  (ulong)(this->inputpath_)._M_dataplus._M_p);
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_d0 = *plVar12;
        lStack_c8 = plVar7[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar12;
        local_e0 = (long *)*plVar7;
      }
      local_d8 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_e0);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0);
      }
      if (local_80[0] != (pointer)local_70) {
        operator_delete(local_80[0]);
      }
    }
    __stream = fopen((char *)local_c0._0_8_,"rb");
    if (__stream == (FILE *)0x0) {
LAB_00105165:
      init_itemtotiv((fmcalc *)local_c0);
      if (local_80[0] != (pointer)local_70) {
        operator_delete(local_80[0]);
      }
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_);
      }
      if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(extraout_RAX);
    }
    fseek(__stream,0,2);
    uVar8 = ftell(__stream);
    fseek(__stream,0,0);
    uVar8 = (ulong)((int)((uVar8 & 0xffffffff) / 0x14) + 1);
    local_e0 = (long *)((ulong)local_e0 & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->item_to_tiv_,uVar8,(value_type_conflict2 *)&local_e0);
    local_e0 = (long *)((ulong)local_e0 & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->item_to_cov_id_,uVar8,(value_type_conflict1 *)&local_e0);
    sVar9 = fread(&local_e0,0x14,1,__stream);
    if (sVar9 != 0) {
      vVar14 = 0.0;
      do {
        vVar6 = (value_type_conflict2)((int)vVar14 + 1);
        vVar14 = (value_type_conflict2)local_e0;
        if ((value_type_conflict2)local_e0 != vVar6) {
          init_itemtotiv();
          goto LAB_00105165;
        }
        (this->item_to_tiv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[(int)(value_type_conflict2)local_e0] =
             local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[local_e0._4_4_];
        (this->item_to_cov_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)(value_type_conflict2)local_e0] = local_e0._4_4_;
        sVar9 = fread(&local_e0,0x14,1,__stream);
      } while (sVar9 != 0);
    }
    fclose(__stream);
    pvVar2 = (this->node_to_direct_sub_nodes_vec_).
             super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    level = (int)((ulong)((long)(this->node_to_direct_sub_nodes_vec_).
                                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) >> 3) *
            -0x55555555 + -1;
    if (1 < (ulong)(((long)*(pointer *)
                            ((long)&pvVar2[level].
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar2[level].
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555)) {
      uVar8 = 1;
      do {
        assign_coverage_ids((set<int,_std::less<int>,_std::allocator<int>_> *)(local_70 + 0x10),this
                            ,level,(int)uVar8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  (local_70 + 0x10));
        pvVar2 = (this->node_to_direct_sub_nodes_vec_).
                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 1;
        uVar13 = ((long)*(pointer *)
                         ((long)&pvVar2[level].
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar2[level].
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
      } while (uVar8 <= uVar13 && uVar13 - uVar8 != 0);
    }
    this_00 = &this->accumulated_tivs_;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(this_00,((long)(this->node_to_coverage_ids_).
                            super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->node_to_coverage_ids_).
                            super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pvVar10 = (this->node_to_coverage_ids_).
              super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->node_to_coverage_ids_).
        super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar10) {
      uVar8 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::resize
                  ((this_00->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar8,
                   ((long)pvVar10[uVar8].
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pvVar10[uVar8].
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
        pfVar4 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar10 = (this->node_to_coverage_ids_).
                  super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = *(long *)&pvVar10[uVar8].
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar15 = (long)*(pointer *)
                        ((long)&pvVar10[uVar8].
                                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar3;
        local_c0._32_8_ = uVar8;
        if (lVar15 != 0) {
          lVar16 = (lVar15 >> 4) * -0x5555555555555555;
          lVar15 = *(long *)&(this_00->
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar8].
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data;
          lVar18 = 0;
          do {
            *(undefined4 *)(lVar15 + lVar18 * 4) = 0;
            lVar1 = lVar18 * 0x30 + lVar3;
            p_Var17 = (_Rb_tree_node_base *)(lVar1 + 8);
            p_Var11 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
            if (p_Var11 != p_Var17) {
              fVar19 = *(float *)(lVar15 + lVar18 * 4);
              do {
                fVar19 = fVar19 + pfVar4[(int)p_Var11[1]._M_color];
                *(float *)(lVar15 + lVar18 * 4) = fVar19;
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
              } while (p_Var11 != p_Var17);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != lVar16 + (ulong)(lVar16 == 0));
        }
        uVar8 = local_c0._32_8_ + 1;
        pvVar10 = (this->node_to_coverage_ids_).
                  super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = ((long)(this->node_to_coverage_ids_).
                        super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 3) *
                 -0x5555555555555555;
      } while (uVar8 <= uVar13 && uVar13 - uVar8 != 0);
    }
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_);
    }
  }
  if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool fmcalc::init_itemtotiv()
{
	std::vector<OASIS_FLOAT> coverages;
	bool has_coverage = loadcoverages(coverages);
	if (!has_coverage) return false;

	FILE *fin = NULL;
	std::string file = ITEMS_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);
	int last_item_id = 0;

	unsigned int nrec = (unsigned int)sz / (unsigned int)sizeof(item);
	item_to_tiv_.resize(nrec + 1, 0.0);
	item_to_cov_id_.resize(nrec + 1, 0);

	item itm;
	size_t i = fread(&itm, sizeof(itm), 1, fin);
	while (i != 0) {
		last_item_id++;
		if (itm.id != last_item_id) {
			fprintf(stderr, "FATAL: Item ids are not contiguous or do not start from one");
			exit(-1);
		}
		last_item_id = itm.id;
        item_to_tiv_[itm.id] = coverages[itm.coverage_id];
        item_to_cov_id_[itm.id] = itm.coverage_id;
		i = fread(&itm, sizeof(itm), 1, fin);
	}
	fclose(fin);

	// Calculate accumulated TIV
	int final_level = node_to_direct_sub_nodes_vec_.size() - 1;
	for (int i = 1; i < node_to_direct_sub_nodes_vec_[final_level].size(); i++) {
		assign_coverage_ids(final_level, i);
	}
	accumulated_tivs_.resize(node_to_coverage_ids_.size());
	for (int i = 0; i < node_to_coverage_ids_.size(); i++) {
		accumulated_tivs_[i].resize(node_to_coverage_ids_[i].size());
		for (int j = 0; j < node_to_coverage_ids_[i].size(); j++) {
			accumulated_tivs_[i][j] = 0;
			for (std::set<int>::iterator k = node_to_coverage_ids_[i][j].begin();
					k != node_to_coverage_ids_[i][j].end(); k++) {
				accumulated_tivs_[i][j] += coverages[*k];
			}
		}
	}
	return true;

}